

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.cpp
# Opt level: O0

void __thiscall
aeron::archive::util::PropertiesReader::PropertiesReader
          (PropertiesReader *this,string *filename,bool skipErrors)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this_00;
  istream *piVar3;
  exception *e;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  string local_280 [8];
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_228 [8];
  ifstream ifs;
  bool skipErrors_local;
  string *filename_local;
  PropertiesReader *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->properties_);
  ::std::ifstream::ifstream(local_228,filename,8);
  bVar1 = ::std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_258,"can\'t open property file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
    ::std::runtime_error::runtime_error(this_00,(string *)&local_258);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string(local_280);
  while( true ) {
    piVar3 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_280);
    bVar2 = ::std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    parseLine(&local_2c0,this,(string *)local_280);
    ::std::
    unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this,&local_2c0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_2c0);
  }
  ::std::__cxx11::string::~string(local_280);
  ::std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

PropertiesReader::PropertiesReader(const std::string& filename, bool skipErrors) {
    std::ifstream ifs(filename);

    if (!ifs.is_open()) {
        throw std::runtime_error("can't open property file: " + filename);
    }

    for (std::string line; std::getline(ifs, line);) {
        try {
            properties_.emplace(parseLine(line));
        } catch (const std::exception& e) {
            // rethrow if requested
            if (!skipErrors) {
                throw e;
            }
        }
    }
}